

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkService
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  long lVar1;
  int iVar2;
  ServiceOptions *pSVar3;
  MethodDescriptorProto *proto_00;
  int local_24;
  int i;
  ServiceDescriptorProto *proto_local;
  ServiceDescriptor *service_local;
  DescriptorBuilder *this_local;
  
  if (*(long *)(service + 0x18) == 0) {
    pSVar3 = ServiceOptions::default_instance();
    *(ServiceOptions **)(service + 0x18) = pSVar3;
  }
  local_24 = 0;
  while( true ) {
    iVar2 = ServiceDescriptor::method_count(service);
    if (iVar2 <= local_24) break;
    lVar1 = *(long *)(service + 0x28);
    proto_00 = ServiceDescriptorProto::method(proto,local_24);
    CrossLinkMethod(this,(MethodDescriptor *)(lVar1 + (long)local_24 * 0x68),proto_00);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkService(
    ServiceDescriptor* service, const ServiceDescriptorProto& proto) {
  if (service->options_ == NULL) {
    service->options_ = &ServiceOptions::default_instance();
  }

  for (int i = 0; i < service->method_count(); i++) {
    CrossLinkMethod(&service->methods_[i], proto.method(i));
  }
}